

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O0

void __thiscall HdlcAnalyzer::ProcessHDLCFrame(HdlcAnalyzer *this)

{
  HdlcByte byteAfterFlag;
  element_type *peVar1;
  undefined1 local_28 [8];
  HdlcByte addressByte;
  HdlcAnalyzer *this_local;
  
  addressByte._16_8_ = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->mCurrentFrameBytes);
  ProcessFlags((HdlcByte *)local_28,this);
  byteAfterFlag.endSample = addressByte.startSample;
  byteAfterFlag.startSample = (U64)local_28;
  byteAfterFlag.value = (undefined1)addressByte.endSample;
  byteAfterFlag.escaped = (bool)addressByte.endSample._1_1_;
  byteAfterFlag._18_6_ = addressByte.endSample._2_6_;
  ProcessAddressField(this,byteAfterFlag);
  ProcessControlField(this);
  ProcessInfoAndFcsField(this);
  if ((this->mAbortFrame & 1U) == 0) {
    AddFrameToResults(this,&this->mEndFlagFrame);
  }
  else {
    AddFrameToResults(this,&this->mAbtFrame);
    peVar1 = std::auto_ptr<HdlcAnalyzerSettings>::operator->(&this->mSettings);
    if (peVar1->mTransmissionMode == HDLC_TRANSMISSION_BIT_SYNC) {
      AnalyzerChannelData::AdvanceToNextEdge();
    }
  }
  this->mReadingFrame = false;
  this->mAbortFrame = false;
  this->mCurrentFrameIsSFrame = false;
  return;
}

Assistant:

void HdlcAnalyzer::ProcessHDLCFrame()
{
    mCurrentFrameBytes.clear();

    HdlcByte addressByte = ProcessFlags();

    ProcessAddressField( addressByte );
    ProcessControlField();
    ProcessInfoAndFcsField();

    if( mAbortFrame ) // The frame has been aborted at some point
    {
        AddFrameToResults( mAbtFrame );
        if( mSettings->mTransmissionMode == HDLC_TRANSMISSION_BIT_SYNC )
        {
            // After abortion, synchronize again
            mHdlc->AdvanceToNextEdge();
        }
    }
    else
    {
        AddFrameToResults( mEndFlagFrame );
    }

    // Reset state bool variables
    mReadingFrame = false;
    mAbortFrame = false;
    mCurrentFrameIsSFrame = false;
}